

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPublicKey.cpp
# Opt level: O0

void __thiscall OSSLRSAPublicKey::createOSSLKey(OSSLRSAPublicKey *this)

{
  RSA *pRVar1;
  RSA_METHOD *meth;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  long in_RDI;
  BIGNUM *bn_e;
  BIGNUM *bn_n;
  
  if (*(long *)(in_RDI + 0x58) == 0) {
    pRVar1 = RSA_new();
    *(RSA **)(in_RDI + 0x58) = pRVar1;
    if (*(long *)(in_RDI + 0x58) == 0) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSAPublicKey.cpp"
                 ,0x83,"Could not create RSA object");
    }
    else {
      pRVar1 = *(RSA **)(in_RDI + 0x58);
      meth = (RSA_METHOD *)RSA_PKCS1_OpenSSL();
      RSA_set_method(pRVar1,meth);
      pBVar2 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar3 = OSSL::byteString2bn((ByteString *)pRVar1);
      RSA_set0_key(*(undefined8 *)(in_RDI + 0x58),pBVar2,pBVar3,0);
    }
  }
  return;
}

Assistant:

void OSSLRSAPublicKey::createOSSLKey()
{
	if (rsa != NULL) return;

	rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Could not create RSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		RSA_set_method(rsa, FIPS_rsa_pkcs1_ssleay());
	else
		RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#else
	RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#endif

#else
	RSA_set_method(rsa, RSA_PKCS1_OpenSSL());
#endif

	BIGNUM* bn_n = OSSL::byteString2bn(n);
	BIGNUM* bn_e = OSSL::byteString2bn(e);

	RSA_set0_key(rsa, bn_n, bn_e, NULL);
}